

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Compaction * __thiscall
leveldb::VersionSet::CompactRange(VersionSet *this,int level,InternalKey *begin,InternalKey *end)

{
  bool bVar1;
  uint64_t uVar2;
  Compaction *pCVar3;
  reference ppFVar4;
  int in_ESI;
  long in_RDI;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *unaff_retaddr;
  InternalKey *in_stack_00000008;
  InternalKey *in_stack_00000010;
  Compaction *c;
  uint64_t s;
  size_t i;
  uint64_t total;
  uint64_t limit;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> inputs;
  Compaction *in_stack_00000118;
  VersionSet *in_stack_00000120;
  undefined8 in_stack_ffffffffffffff78;
  Options *in_stack_ffffffffffffff80;
  Compaction *in_stack_ffffffffffffff90;
  int iVar5;
  Options *in_stack_ffffffffffffff98;
  Compaction *in_stack_ffffffffffffffa0;
  Compaction *pCVar6;
  ulong local_58;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> local_40;
  int local_14;
  Compaction *local_8;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_14 = in_ESI;
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)0x12d3ce);
  Version::GetOverlappingInputs
            ((Version *)s,c._4_4_,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  bVar1 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                    ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     in_stack_ffffffffffffff90);
  if (bVar1) {
    local_8 = (Compaction *)0x0;
  }
  else {
    if (0 < local_14) {
      uVar2 = MaxFileSizeForLevel(in_stack_ffffffffffffff80,iVar5);
      local_58 = 0;
      pCVar6 = (Compaction *)0x0;
      while (in_stack_ffffffffffffffa0 = pCVar6,
            pCVar3 = (Compaction *)
                     std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     ::size(&local_40), pCVar6 < pCVar3) {
        ppFVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  operator[](&local_40,(size_type)in_stack_ffffffffffffffa0);
        in_stack_ffffffffffffff98 = (Options *)(*ppFVar4)->file_size;
        local_58 = (long)in_stack_ffffffffffffff98->compressors + (local_58 - 0x50);
        if (uVar2 <= local_58) {
          std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::resize
                    ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
          break;
        }
        pCVar6 = (Compaction *)
                 ((long)&(((_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)&in_stack_ffffffffffffffa0->level_)->_M_impl).super__Vector_impl_data.
                         _M_start + 1);
      }
    }
    iVar5 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
    in_stack_ffffffffffffff90 = (Compaction *)operator_new(0x158);
    Compaction::Compaction(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,iVar5);
    in_stack_ffffffffffffff90->input_version_ = *(Version **)(in_RDI + 0x168);
    Version::Ref(in_stack_ffffffffffffff90->input_version_);
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator=
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)s,
               (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               CONCAT44(c._4_4_,c._0_4_));
    SetupOtherInputs(in_stack_00000120,in_stack_00000118);
    local_8 = in_stack_ffffffffffffff90;
  }
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
             in_stack_ffffffffffffff90);
  return local_8;
}

Assistant:

Compaction* VersionSet::CompactRange(int level, const InternalKey* begin,
                                     const InternalKey* end) {
  std::vector<FileMetaData*> inputs;
  current_->GetOverlappingInputs(level, begin, end, &inputs);
  if (inputs.empty()) {
    return nullptr;
  }

  // Avoid compacting too much in one shot in case the range is large.
  // But we cannot do this for level-0 since level-0 files can overlap
  // and we must not pick one file and drop another older file if the
  // two files overlap.
  if (level > 0) {
    const uint64_t limit = MaxFileSizeForLevel(options_, level);
    uint64_t total = 0;
    for (size_t i = 0; i < inputs.size(); i++) {
      uint64_t s = inputs[i]->file_size;
      total += s;
      if (total >= limit) {
        inputs.resize(i + 1);
        break;
      }
    }
  }

  Compaction* c = new Compaction(options_, level);
  c->input_version_ = current_;
  c->input_version_->Ref();
  c->inputs_[0] = inputs;
  SetupOtherInputs(c);
  return c;
}